

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

ssize_t write_iso9660_data(archive_write *a,void *buff,size_t s)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  archive_write *in_RDX;
  archive_write *in_RSI;
  archive *in_RDI;
  size_t ts;
  content_conflict *con;
  size_t ws;
  iso9660_conflict *iso9660;
  int64_t in_stack_ffffffffffffffc8;
  size_t s_00;
  archive_write *local_8;
  
  s_00 = *(size_t *)&in_RDI[1].current_codepage;
  if (*(int *)(s_00 + 8) < 0) {
    archive_set_error(in_RDI,-1,"Couldn\'t create temporary file");
    return -0x1e;
  }
  local_8 = in_RDX;
  if ((*(int *)(s_00 + 0x40) != 0) &&
     (0xfffff7ff <
      (ulong)((long)&(in_RDX->archive).magic +
             *(long *)(*(long *)(*(long *)(s_00 + 0x10) + 0xb0) + 8)))) {
    lVar3 = 0xfffff800 - *(long *)(*(long *)(*(long *)(s_00 + 0x10) + 0xb0) + 8);
    if ((char)(*(char *)(s_00 + 0x1d8) << 7) < '\0') {
      zisofs_detect_magic((archive_write *)buff,(void *)s,(size_t)iso9660);
    }
    if ((char)(*(char *)(s_00 + 0x1d8) << 6) < '\0') {
      iVar2 = zisofs_write_to_temp((archive_write *)ws,con,ts);
      if (iVar2 != 0) {
        return -0x1e;
      }
    }
    else {
      iVar2 = wb_write_to_temp(in_RSI,local_8,s_00);
      if (iVar2 != 0) {
        return -0x1e;
      }
      lVar1 = *(long *)(*(long *)(s_00 + 0x10) + 0xb0);
      *(long *)(lVar1 + 8) = lVar3 + *(long *)(lVar1 + 8);
    }
    iVar2 = wb_write_padding_to_temp(in_RDX,in_stack_ffffffffffffffc8);
    if (iVar2 != 0) {
      return -0x1e;
    }
    *(int *)(*(long *)(*(long *)(s_00 + 0x10) + 0xb0) + 0x10) =
         (int)(*(long *)(*(long *)(*(long *)(s_00 + 0x10) + 0xb0) + 8) + 0x7ff >> 0xb);
    in_RDX = (archive_write *)((long)in_RDX - lVar3);
    in_RSI = (archive_write *)((long)in_RSI + lVar3);
    plVar4 = (long *)calloc(1,0x20);
    if (plVar4 == (long *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate content data");
      return -0x1e;
    }
    *plVar4 = (*(long *)(*(long *)&in_RDI[1].current_codepage + 0x102f0) + 0x10000) -
              *(long *)(*(long *)&in_RDI[1].current_codepage + 0x102e0);
    *(long **)(*(long *)(*(long *)(s_00 + 0x10) + 0xb0) + 0x18) = plVar4;
    *(long **)(*(long *)(s_00 + 0x10) + 0xb0) = plVar4;
    *(undefined8 *)(s_00 + 0x240) = 0;
  }
  if ((char)(*(char *)(s_00 + 0x1d8) << 7) < '\0') {
    zisofs_detect_magic((archive_write *)buff,(void *)s,(size_t)iso9660);
  }
  if ((char)(*(char *)(s_00 + 0x1d8) << 6) < '\0') {
    iVar2 = zisofs_write_to_temp((archive_write *)ws,con,ts);
    if (iVar2 != 0) {
      local_8 = (archive_write *)0xffffffffffffffe2;
    }
  }
  else {
    iVar2 = wb_write_to_temp(in_RSI,local_8,s_00);
    if (iVar2 == 0) {
      lVar3 = *(long *)(*(long *)(s_00 + 0x10) + 0xb0);
      *(long *)(lVar3 + 8) = (long)&(in_RDX->archive).magic + *(long *)(lVar3 + 8);
    }
    else {
      local_8 = (archive_write *)0xffffffffffffffe2;
    }
  }
  return (ssize_t)local_8;
}

Assistant:

static ssize_t
write_iso9660_data(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	size_t ws;

	if (iso9660->temp_fd < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Couldn't create temporary file");
		return (ARCHIVE_FATAL);
	}

	ws = s;
	if (iso9660->need_multi_extent &&
	    (iso9660->cur_file->cur_content->size + ws) >=
	      (MULTI_EXTENT_SIZE - LOGICAL_BLOCK_SIZE)) {
		struct content *con;
		size_t ts;

		ts = (size_t)(MULTI_EXTENT_SIZE - LOGICAL_BLOCK_SIZE -
		    iso9660->cur_file->cur_content->size);

		if (iso9660->zisofs.detect_magic)
			zisofs_detect_magic(a, buff, ts);

		if (iso9660->zisofs.making) {
			if (zisofs_write_to_temp(a, buff, ts) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		} else {
			if (wb_write_to_temp(a, buff, ts) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			iso9660->cur_file->cur_content->size += ts;
		}

		/* Write padding. */
		if (wb_write_padding_to_temp(a,
		    iso9660->cur_file->cur_content->size) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);

		/* Compute the logical block number. */
		iso9660->cur_file->cur_content->blocks = (int)
		    ((iso9660->cur_file->cur_content->size
		     + LOGICAL_BLOCK_SIZE -1) >> LOGICAL_BLOCK_BITS);

		/*
		 * Make next extent.
		 */
		ws -= ts;
		buff = (const void *)(((const unsigned char *)buff) + ts);
		/* Make a content for next extent. */
		con = calloc(1, sizeof(*con));
		if (con == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate content data");
			return (ARCHIVE_FATAL);
		}
		con->offset_of_temp = wb_offset(a);
		iso9660->cur_file->cur_content->next = con;
		iso9660->cur_file->cur_content = con;
#ifdef HAVE_ZLIB_H
		iso9660->zisofs.block_offset = 0;
#endif
	}

	if (iso9660->zisofs.detect_magic)
		zisofs_detect_magic(a, buff, ws);

	if (iso9660->zisofs.making) {
		if (zisofs_write_to_temp(a, buff, ws) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	} else {
		if (wb_write_to_temp(a, buff, ws) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		iso9660->cur_file->cur_content->size += ws;
	}

	return (s);
}